

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressSuperBlock(ZSTD_CCtx *zc,void *dst,size_t dstCapacity,uint lastBlock)

{
  seqStore_t *seqStorePtr;
  FSE_repeat *pFVar1;
  seqDef *psVar2;
  ZSTD_compressedBlockState_t *pZVar3;
  uint *puVar4;
  uint uVar5;
  symbolEncodingType_e sVar6;
  int iVar7;
  size_t err_code;
  BYTE *pBVar8;
  size_t sVar9;
  BYTE *pBVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  long lVar14;
  U16 *pUVar15;
  long lVar16;
  size_t err_code_3;
  uint uVar17;
  ZSTD_compressedBlockState_t *pZVar18;
  ulong uVar19;
  ZSTD_fseCTables_t *pZVar20;
  size_t dstCapacity_00;
  BYTE *__dest;
  FSE_CTable *pFVar21;
  seqDef *sstart;
  BYTE *pBVar22;
  seqDef *psVar23;
  BYTE *pBVar24;
  uint *countWksp;
  size_t err_code_4;
  ulong uVar25;
  bool bVar26;
  byte bVar27;
  bool bVar28;
  bool bVar29;
  ulong wkspSize;
  uint maxSymbolValue;
  ZSTD_compressedBlockState_t *local_518;
  byte local_50a;
  byte local_509;
  BYTE *local_508;
  ulong local_500;
  seqDef *sstart_1;
  seqDef *local_4f0;
  BYTE *local_4e8;
  BYTE *local_4e0;
  ZSTD_compressedBlockState_t *local_4d8;
  undefined2 *local_4d0;
  BYTE *local_4c8;
  ZSTD_compressedBlockState_t *local_4c0;
  BYTE *local_4b8;
  size_t local_4b0;
  BYTE *local_4a8;
  ZSTD_fseCTables_t *local_4a0;
  uint *local_498;
  ZSTD_CCtx *local_490;
  BYTE *local_488;
  uint local_47c;
  undefined2 *local_478;
  FSE_CTable *local_470;
  FSE_CTable *local_468;
  ZSTD_fseCTables_t *local_460;
  ulong local_458;
  uint *local_450;
  size_t local_448;
  ZSTD_entropyCTablesMetadata_t entropyMetadata;
  
  local_518 = (zc->blockState).prevCBlock;
  pZVar3 = (zc->blockState).nextCBlock;
  puVar4 = zc->entropyWorkspace;
  pBVar8 = (zc->seqStore).litStart;
  pBVar22 = (zc->seqStore).lit + -(long)pBVar8;
  maxSymbolValue = 0xff;
  wkspSize = 0x10d817;
  local_4b0 = dstCapacity;
  local_490 = zc;
  local_47c = lastBlock;
  local_478 = (undefined2 *)dst;
  memcpy(pZVar3,local_518,0x404);
  if (pBVar22 < (BYTE *)0x40) {
    entropyMetadata.hufMetadata.hType = set_basic;
    entropyMetadata.hufMetadata.hufDesSize = 0;
    goto LAB_0010d950;
  }
  wkspSize = 0x10d839;
  entropyMetadata.hufMetadata.hufDesSize =
       HIST_count_wksp(puVar4,&maxSymbolValue,pBVar8,(size_t)pBVar22,puVar4,0x1800);
  bVar29 = false;
  if (entropyMetadata.hufMetadata.hufDesSize < (BYTE *)0xffffffffffffff89) {
    if ((BYTE *)entropyMetadata.hufMetadata.hufDesSize == pBVar22) {
      entropyMetadata.hufMetadata.hType = set_rle;
    }
    else {
      bVar29 = true;
      bVar28 = (char *)(((ulong)pBVar22 >> 7) + 4) < entropyMetadata.hufMetadata.hufDesSize;
      entropyMetadata.hufMetadata.hufDesSize = (size_t)(BYTE *)0x0;
      if (bVar28) goto LAB_0010d891;
      entropyMetadata.hufMetadata.hType = set_basic;
    }
    bVar29 = false;
    entropyMetadata.hufMetadata.hufDesSize = (size_t)(BYTE *)0x0;
  }
LAB_0010d891:
  if (bVar29) {
    memset(pZVar3,0,0x400);
    uVar17 = maxSymbolValue;
    uVar19 = (ulong)maxSymbolValue;
    uVar5 = FSE_optimalTableLog_internal(0xb,(size_t)pBVar22,maxSymbolValue,1);
    wkspSize = 0x10d8de;
    entropyMetadata.hufMetadata.hufDesSize =
         HUF_buildCTable_wksp((HUF_CElt *)pZVar3,puVar4,uVar17,uVar5,puVar4 + 0x100,0x1400);
    if (entropyMetadata.hufMetadata.hufDesSize < (BYTE *)0xffffffffffffff89) {
      if ((int)uVar17 < 0) {
        uVar25 = 0;
      }
      else {
        lVar16 = 0;
        uVar25 = 0;
        do {
          uVar25 = uVar25 + (uint)*(byte *)((long)(pZVar3->entropy).huf.CTable + lVar16 * 4 + 2) *
                            puVar4[lVar16];
          lVar16 = lVar16 + 1;
        } while (uVar19 + 1 != lVar16);
        uVar25 = uVar25 >> 3;
      }
      wkspSize = 0x10d93a;
      pBVar8 = (BYTE *)HUF_writeCTable(entropyMetadata.hufMetadata.hufDesBuffer,500,
                                       (HUF_CElt *)pZVar3,uVar17,
                                       (uint)entropyMetadata.hufMetadata.hufDesSize);
      entropyMetadata.hufMetadata.hufDesSize = (size_t)(BYTE *)0x0;
      if (pBVar8 + uVar25 < pBVar22) {
        entropyMetadata.hufMetadata.hufDesSize = (size_t)pBVar8;
      }
      entropyMetadata.hufMetadata.hType = (uint)(pBVar8 + uVar25 < pBVar22) * 2;
    }
  }
LAB_0010d950:
  local_4e8 = (BYTE *)entropyMetadata.hufMetadata.hufDesSize;
  if (entropyMetadata.hufMetadata.hufDesSize < (BYTE *)0xffffffffffffff89) {
    seqStorePtr = &local_490->seqStore;
    local_500 = (ulong)(local_490->appliedParams).cParams.strategy;
    local_4f0 = (seqDef *)(local_490->seqStore).ofCode;
    pBVar8 = (local_490->seqStore).llCode;
    local_4e8 = (local_490->seqStore).mlCode;
    psVar23 = (seqDef *)
              ((long)(local_490->seqStore).sequences - (long)(local_490->seqStore).sequencesStart >>
              3);
    memset(puVar4,0,0x1800);
    entropyMetadata.fseMetadata.lastCountSize = 0;
    ZSTD_seqToCodes(seqStorePtr);
    maxSymbolValue = 0x23;
    local_4e0 = pBVar8;
    sVar9 = HIST_countFast_wksp(puVar4,&maxSymbolValue,pBVar8,(size_t)psVar23,puVar4,0x1800);
    uVar17 = maxSymbolValue;
    pFVar1 = &(pZVar3->entropy).fse.litlength_repeatMode;
    (pZVar3->entropy).fse.litlength_repeatMode = (local_518->entropy).fse.litlength_repeatMode;
    pFVar21 = (local_518->entropy).fse.litlengthCTable;
    sstart_1 = psVar23;
    local_4d8 = pZVar3;
    sVar6 = ZSTD_selectEncodingType
                      (pFVar1,puVar4,maxSymbolValue,sVar9,(size_t)psVar23,9,pFVar21,LL_defaultNorm,6
                       ,ZSTD_defaultAllowed,(ZSTD_strategy)local_500);
    if ((sVar6 < set_compressed) && (*pFVar1 != FSE_repeat_none)) {
      __assert_fail("!(LLtype < set_compressed && nextEntropy->litlength_repeatMode != FSE_repeat_none)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x260a,
                    "size_t ZSTD_buildSuperBlockEntropy_sequences(seqStore_t *, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, const ZSTD_CCtx_params *, ZSTD_fseCTablesMetadata_t *, void *, size_t)"
                   );
    }
    local_508 = (BYTE *)(puVar4 + 0x35);
    pBVar8 = entropyMetadata.fseMetadata.fseTablesBuffer;
    wkspSize = 0x172c;
    local_498 = puVar4;
    pBVar22 = (BYTE *)ZSTD_buildCTable(pBVar8,500,(local_4d8->entropy).fse.litlengthCTable,9,sVar6,
                                       puVar4,uVar17,local_4e0,(size_t)sstart_1,LL_defaultNorm,6,
                                       0x23,pFVar21,0x524,local_508,0x172c);
    puVar4 = local_498;
    psVar23 = sstart_1;
    pZVar3 = local_518;
    if (pBVar22 < (BYTE *)0xffffffffffffff89) {
      if (sVar6 == set_compressed) {
        entropyMetadata.fseMetadata.lastCountSize = (size_t)pBVar22;
      }
      pBVar8 = pBVar8 + (long)pBVar22;
      entropyMetadata.fseMetadata.llType = sVar6;
    }
    if (pBVar22 < (BYTE *)0xffffffffffffff89) {
      local_4a0 = &(local_518->entropy).fse;
      maxSymbolValue = 0x1f;
      local_4e0 = pBVar8;
      sVar9 = HIST_countFast_wksp(local_498,&maxSymbolValue,local_4f0,(size_t)sstart_1,local_498,
                                  0x1800);
      pZVar20 = local_4a0;
      local_4a8 = (BYTE *)(ulong)maxSymbolValue;
      pFVar1 = &(local_4d8->entropy).fse.offcode_repeatMode;
      (local_4d8->entropy).fse.offcode_repeatMode = (pZVar3->entropy).fse.offcode_repeatMode;
      sVar6 = ZSTD_selectEncodingType
                        (pFVar1,puVar4,maxSymbolValue,sVar9,(size_t)psVar23,8,
                         local_4a0->offcodeCTable,OF_defaultNorm,5,(uint)(maxSymbolValue < 0x1d),
                         (ZSTD_strategy)local_500);
      pBVar8 = local_4e0;
      if ((sVar6 < set_compressed) && (*pFVar1 != FSE_repeat_none)) {
        __assert_fail("!(Offtype < set_compressed && nextEntropy->offcode_repeatMode != FSE_repeat_none)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2622,
                      "size_t ZSTD_buildSuperBlockEntropy_sequences(seqStore_t *, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, const ZSTD_CCtx_params *, ZSTD_fseCTablesMetadata_t *, void *, size_t)"
                     );
      }
      wkspSize = 0x172c;
      pBVar10 = (BYTE *)ZSTD_buildCTable(local_4e0,
                                         (long)&entropyMetadata + (0x400 - (long)local_4e0),
                                         (local_4d8->entropy).fse.offcodeCTable,8,sVar6,puVar4,
                                         (U32)local_4a8,(BYTE *)local_4f0,(size_t)sstart_1,
                                         OF_defaultNorm,5,0x1c,pZVar20->offcodeCTable,0x304,
                                         local_508,0x172c);
      pZVar3 = local_4d8;
      psVar23 = sstart_1;
      pBVar24 = pBVar10;
      if (pBVar10 < (BYTE *)0xffffffffffffff89) {
        if (sVar6 == set_compressed) {
          entropyMetadata.fseMetadata.lastCountSize = (size_t)pBVar10;
        }
        local_4e0 = pBVar8 + (long)pBVar10;
        pBVar24 = pBVar22;
        entropyMetadata.fseMetadata.ofType = sVar6;
      }
      pBVar22 = pBVar24;
      if (pBVar10 < (BYTE *)0xffffffffffffff89) {
        maxSymbolValue = 0x34;
        sVar9 = HIST_countFast_wksp(puVar4,&maxSymbolValue,local_4e8,(size_t)sstart_1,puVar4,0x1800)
        ;
        uVar17 = maxSymbolValue;
        pFVar1 = &(pZVar3->entropy).fse.matchlength_repeatMode;
        (pZVar3->entropy).fse.matchlength_repeatMode =
             (local_518->entropy).fse.matchlength_repeatMode;
        pFVar21 = (local_518->entropy).fse.matchlengthCTable;
        sVar6 = ZSTD_selectEncodingType
                          (pFVar1,puVar4,maxSymbolValue,sVar9,(size_t)psVar23,9,pFVar21,
                           ML_defaultNorm,6,ZSTD_defaultAllowed,(ZSTD_strategy)local_500);
        if ((sVar6 < set_compressed) && (*pFVar1 != FSE_repeat_none)) {
          __assert_fail("!(MLtype < set_compressed && nextEntropy->matchlength_repeatMode != FSE_repeat_none)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2638,
                        "size_t ZSTD_buildSuperBlockEntropy_sequences(seqStore_t *, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, const ZSTD_CCtx_params *, ZSTD_fseCTablesMetadata_t *, void *, size_t)"
                       );
        }
        wkspSize = 0x172c;
        pBVar10 = (BYTE *)ZSTD_buildCTable(local_4e0,
                                           (long)&entropyMetadata + (0x400 - (long)local_4e0),
                                           (local_4d8->entropy).fse.matchlengthCTable,9,sVar6,puVar4
                                           ,uVar17,local_4e8,(size_t)sstart_1,ML_defaultNorm,6,0x34,
                                           pFVar21,0x5ac,local_508,0x172c);
        pBVar8 = local_4e0;
        pBVar24 = pBVar10;
        if (pBVar10 < (BYTE *)0xffffffffffffff89) {
          if (sVar6 == set_compressed) {
            entropyMetadata.fseMetadata.lastCountSize = (size_t)pBVar10;
          }
          pBVar8 = local_4e0 + (long)pBVar10;
          pBVar24 = pBVar22;
          entropyMetadata.fseMetadata.mlType = sVar6;
        }
        pBVar22 = pBVar24;
        if ((pBVar10 < (BYTE *)0xffffffffffffff89) &&
           (pBVar22 = pBVar8 + -(long)entropyMetadata.fseMetadata.fseTablesBuffer,
           (BYTE *)0x1f4 < pBVar22)) {
          __assert_fail("(size_t) (op-ostart) <= sizeof(fseMetadata->fseTablesBuffer)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2643,
                        "size_t ZSTD_buildSuperBlockEntropy_sequences(seqStore_t *, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, const ZSTD_CCtx_params *, ZSTD_fseCTablesMetadata_t *, void *, size_t)"
                       );
        }
      }
    }
    local_4e8 = (BYTE *)0x0;
    entropyMetadata.fseMetadata.fseTablesSize = (size_t)pBVar22;
    if ((BYTE *)0xffffffffffffff88 < pBVar22) {
      local_4e8 = pBVar22;
    }
  }
  if (local_4e8 < (BYTE *)0xffffffffffffff89) {
    local_4c0 = (local_490->blockState).nextCBlock;
    psVar23 = (local_490->seqStore).sequencesStart;
    local_4d8 = (ZSTD_compressedBlockState_t *)(local_490->seqStore).sequences;
    local_4c8 = (local_490->seqStore).litStart;
    lVar16 = (long)local_4d8 - (long)psVar23;
    if (lVar16 < 1) {
      lVar14 = 0;
    }
    else {
      pUVar15 = &psVar23->matchLength;
      lVar14 = 0;
      do {
        lVar14 = lVar14 + (ulong)*pUVar15 + 3;
        pUVar15 = pUVar15 + 4;
        bVar29 = SCARRY8(lVar16,-8);
        lVar16 = lVar16 + -8;
      } while (lVar16 != 0 && bVar29 == lVar16 < 0);
    }
    local_488 = (local_490->seqStore).lit + (lVar14 - (long)local_4c8);
    local_458 = (ulong)(uint)local_490->bmi2;
    local_450 = local_490->entropyWorkspace;
    local_4b0 = (long)local_478 + local_4b0;
    local_498 = (uint *)(local_490->seqStore).llCode;
    local_4a0 = (ZSTD_fseCTables_t *)(local_490->seqStore).mlCode;
    local_4a8 = (local_490->seqStore).ofCode;
    local_448 = (local_490->appliedParams).targetCBlockSize;
    local_460 = &(local_4c0->entropy).fse;
    local_468 = (local_4c0->entropy).fse.litlengthCTable;
    local_470 = (local_4c0->entropy).fse.matchlengthCTable;
    local_500 = CONCAT44(local_500._4_4_,1);
    local_518 = (ZSTD_compressedBlockState_t *)0x0;
    pBVar8 = (BYTE *)0x0;
    local_4d0 = local_478;
    do {
      puVar4 = local_450;
      pZVar3 = local_4c0;
      psVar2 = psVar23 + (long)pBVar8;
      if (local_4d8 <= psVar2) {
        if (local_488 != (BYTE *)0x0) {
          return (size_t)(BYTE *)0x0;
        }
        return (size_t)(BYTE *)((long)local_4d0 - (long)local_478);
      }
      local_518 = (ZSTD_compressedBlockState_t *)((long)local_518 + (ulong)psVar2->litLength);
      maxSymbolValue = 0xff;
      pZVar18 = local_518;
      if (entropyMetadata.hufMetadata.hType != set_basic) {
        if (entropyMetadata.hufMetadata.hType == set_compressed) {
          wkspSize = 0x10df61;
          sVar9 = HIST_count_wksp(local_450,&maxSymbolValue,local_4c8,(size_t)local_518,local_450,
                                  0x1800);
          pZVar18 = local_518;
          if (sVar9 < 0xffffffffffffff89) {
            if ((int)maxSymbolValue < 0) {
              lVar16 = 3;
            }
            else {
              lVar16 = 0;
              uVar19 = 0;
              do {
                uVar19 = uVar19 + (uint)*(byte *)((long)(pZVar3->entropy).huf.CTable +
                                                 lVar16 * 4 + 2) * puVar4[lVar16];
                lVar16 = lVar16 + 1;
              } while ((ulong)maxSymbolValue + 1 != lVar16);
              lVar16 = (uVar19 >> 3) + 3;
            }
            sVar9 = entropyMetadata.hufMetadata.hufDesSize;
            if ((int)local_500 == 0) {
              sVar9 = 0;
            }
            pZVar18 = (ZSTD_compressedBlockState_t *)(lVar16 + sVar9);
          }
        }
        else {
          if (entropyMetadata.hufMetadata.hType != set_rle) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x277b,
                          "size_t ZSTD_estimateSubBlockSize_literal(const BYTE *, size_t, const ZSTD_hufCTables_t *, const ZSTD_hufCTablesMetadata_t *, void *, size_t, int)"
                         );
          }
          pZVar18 = (ZSTD_compressedBlockState_t *)1;
        }
      }
      pBVar22 = pBVar8 + 1;
      local_508 = pBVar8;
      sstart_1 = psVar23;
      local_4f0 = psVar2;
      sVar11 = ZSTD_estimateSubBlockSize_symbolType
                         (entropyMetadata.fseMetadata.ofType,local_4a8,0x1f,(size_t)pBVar22,
                          local_460->offcodeCTable,(U32 *)0x0,OF_defaultNorm,5,puVar4,wkspSize);
      sVar12 = ZSTD_estimateSubBlockSize_symbolType
                         (entropyMetadata.fseMetadata.llType,(BYTE *)local_498,0x23,(size_t)pBVar22,
                          local_468,LL_bits,LL_defaultNorm,6,puVar4,wkspSize);
      pZVar20 = local_4a0;
      local_4e0 = pBVar22;
      sVar13 = ZSTD_estimateSubBlockSize_symbolType
                         (entropyMetadata.fseMetadata.mlType,(BYTE *)local_4a0,0x34,(size_t)pBVar22,
                          local_470,ML_bits,ML_defaultNorm,6,puVar4,wkspSize);
      pBVar8 = local_4e0;
      sVar9 = 0;
      if ((int)local_500 != 0) {
        sVar9 = entropyMetadata.fseMetadata.fseTablesSize;
      }
      dstCapacity_00 = CONCAT71((int7)((ulong)pZVar20 >> 8),1);
      if ((local_448 < sVar9 + (long)pZVar18 + sVar11 + sVar12 + sVar13 + 6) ||
         (psVar23 = sstart_1, (ZSTD_compressedBlockState_t *)(local_4f0 + 1) == local_4d8)) {
        if (local_508 < (BYTE *)0x7fffffffffffffff) {
          lVar14 = (long)local_508 * 8 + 8;
          pUVar15 = &sstart_1->matchLength;
          lVar16 = 0;
          do {
            lVar16 = lVar16 + (ulong)*pUVar15 + 3;
            lVar14 = lVar14 + -8;
            pUVar15 = pUVar15 + 4;
          } while (0 < lVar14);
        }
        else {
          lVar16 = 0;
        }
        bVar27 = (ZSTD_compressedBlockState_t *)(local_4f0 + 1) == local_4d8;
        bVar28 = local_47c != 0;
        lVar14 = ((ulong)(0x3ff < local_518) + 1) - (ulong)(local_518 < 0x4000);
        psVar23 = (seqDef *)((long)local_4d0 + 3);
        bVar29 = (int)local_500 != 0;
        if (((int)local_500 == 0) || (local_518 != (ZSTD_compressedBlockState_t *)0x0)) {
          sVar9 = local_4b0 + (-3 - (long)local_4d0);
          if (local_518 == (ZSTD_compressedBlockState_t *)0x0) {
LAB_0010e1a8:
            wkspSize = 0x10e1c1;
            pBVar22 = (BYTE *)ZSTD_noCompressLiterals(psVar23,sVar9,local_4c8,(size_t)local_518);
          }
          else {
            if (entropyMetadata.hufMetadata.hType != set_rle) {
              if (entropyMetadata.hufMetadata.hType != set_basic) {
                local_508 = (BYTE *)CONCAT71(local_508._1_7_,bVar27);
                pBVar22 = (BYTE *)((long)local_4d0 + lVar14 + 6);
                bVar26 = local_518 < 0x100;
                bVar27 = lVar14 == 0;
                local_509 = bVar29;
                local_4f0 = psVar23;
                if ((int)local_500 == 0) {
                  sVar11 = 0;
                }
                else {
                  local_4b8 = (BYTE *)CONCAT71(local_4b8._1_7_,bVar27);
                  memcpy(pBVar22,entropyMetadata.hufMetadata.hufDesBuffer,
                         entropyMetadata.hufMetadata.hufDesSize);
                  pBVar22 = pBVar22 + entropyMetadata.hufMetadata.hufDesSize;
                  sVar11 = entropyMetadata.hufMetadata.hufDesSize;
                  bVar27 = (byte)local_4b8;
                }
                local_50a = bVar26 | bVar27;
                local_4b8 = pBVar22;
                if (local_50a == 0) {
                  wkspSize = 0x10e3e4;
                  sVar12 = HUF_compress4X_usingCTable_internal
                                     (pBVar22,local_4b0 - (long)pBVar22,local_4c8,(size_t)local_518,
                                      (HUF_CElt *)local_4c0,0);
                }
                else {
                  wkspSize = 0x10e3cd;
                  sVar12 = HUF_compress1X_usingCTable_internal
                                     (pBVar22,local_4b0 - (long)pBVar22,local_4c8,(size_t)local_518,
                                      (HUF_CElt *)local_4c0,0);
                }
                uVar19 = sVar11 + sVar12;
                bVar27 = (byte)local_508;
                if (sVar12 - 1 < 0xffffffffffffff88) {
                  bVar29 = uVar19 <= local_518;
                  if ((int)local_500 == 0) {
                    pBVar22 = (BYTE *)0x0;
                    if (local_518 < uVar19) {
                      wkspSize = 0x10e43d;
                      pBVar22 = (BYTE *)ZSTD_noCompressLiterals
                                                  (local_4f0,sVar9,local_4c8,(size_t)local_518);
                      bVar29 = false;
                      bVar27 = (byte)local_508;
                    }
                  }
                  else {
                    pBVar22 = (BYTE *)0x0;
                  }
                }
                else {
                  bVar29 = false;
                  pBVar22 = (BYTE *)0x0;
                }
                dstCapacity_00 = 1;
                psVar23 = local_4f0;
                if (bVar29) {
                  uVar5 = local_509 ^ 3;
                  iVar7 = (int)local_518;
                  uVar17 = (uint)uVar19;
                  if (lVar14 == 2) {
                    *(uint *)((long)local_4d0 + 3) = uVar17 * 0x400000 + (uVar5 | iVar7 << 4) + 0xc;
                    *(char *)((long)local_4d0 + 7) = (char)(uVar17 >> 10);
                  }
                  else if (lVar14 == 1) {
                    local_4f0->offset = (uVar5 | iVar7 << 4) + uVar17 * 0x40000 + 8;
                  }
                  else {
                    iVar7 = uVar17 * 0x4000 + ((iVar7 * 0x10 + (uint)local_50a * 4 | uVar5) ^ 4);
                    *(short *)((long)local_4d0 + 3) = (short)iVar7;
                    *(char *)((long)local_4d0 + 5) = (char)((uint)iVar7 >> 0x10);
                  }
                  pBVar22 = local_4b8 + (sVar12 - (long)local_4f0);
                }
                goto LAB_0010e1ed;
              }
              goto LAB_0010e1a8;
            }
            wkspSize = 0x10e1d9;
            pBVar22 = (BYTE *)ZSTD_compressRleLiteralsBlock
                                        (psVar23,dstCapacity_00,local_4c8,(size_t)local_518);
          }
          dstCapacity_00 = 1;
        }
        else {
          pBVar22 = (BYTE *)0x0;
        }
LAB_0010e1ed:
        if (pBVar22 < (BYTE *)0xffffffffffffff89) {
          if (pBVar22 == (BYTE *)0x0) {
            bVar29 = false;
            pBVar22 = (BYTE *)0x0;
          }
          else {
            psVar23 = (seqDef *)((long)&psVar23->offset + (long)pBVar22);
            bVar29 = true;
          }
        }
        else {
          bVar29 = false;
        }
        if (bVar29) {
          uVar17 = (local_490->appliedParams).cParams.windowLog;
          pBVar24 = (BYTE *)0xffffffffffffffba;
          if (3 < (long)(local_4b0 - (long)psVar23)) {
            if (pBVar8 < (BYTE *)0x7f) {
              pBVar10 = (BYTE *)((long)&psVar23->offset + 1);
              *(BYTE *)&psVar23->offset = (BYTE)pBVar8;
            }
            else if (pBVar8 < (BYTE *)0x7f00) {
              *(byte *)&psVar23->offset = (byte)((ulong)pBVar8 >> 8) | 0x80;
              *(BYTE *)((long)&psVar23->offset + 1) = (BYTE)pBVar8;
              pBVar10 = (BYTE *)((long)&psVar23->offset + 2);
            }
            else {
              *(BYTE *)&psVar23->offset = 0xff;
              *(short *)((long)&psVar23->offset + 1) = (short)pBVar8 + -0x7f00;
              pBVar10 = (BYTE *)((long)&psVar23->offset + 3);
            }
            if (pBVar8 == (BYTE *)0x0 && (int)local_500 != 0) {
              pBVar24 = (BYTE *)0x0;
            }
            else if (pBVar8 == (BYTE *)0x0) {
              pBVar24 = pBVar10 + -(long)psVar23;
            }
            else {
              local_508 = (BYTE *)CONCAT71(local_508._1_7_,bVar27);
              __dest = pBVar10 + 1;
              local_4f0 = psVar23;
              if ((int)local_500 == 0) {
                *pBVar10 = 0xfc;
              }
              else {
                *pBVar10 = (char)(entropyMetadata.fseMetadata.ofType << 4) +
                           (char)(entropyMetadata.fseMetadata.llType << 6) +
                           (char)entropyMetadata.fseMetadata.mlType * '\x04';
                local_4b8 = pBVar10;
                memcpy(__dest,entropyMetadata.fseMetadata.fseTablesBuffer,
                       entropyMetadata.fseMetadata.fseTablesSize);
                __dest = __dest + entropyMetadata.fseMetadata.fseTablesSize;
                pBVar10 = local_4b8;
              }
              wkspSize = local_458;
              pBVar24 = (BYTE *)ZSTD_encodeSequences
                                          (__dest,local_4b0 - (long)__dest,local_470,
                                           (BYTE *)local_4a0,local_460->offcodeCTable,local_4a8,
                                           local_468,(BYTE *)local_498,sstart_1,(size_t)pBVar8,
                                           (uint)(0x39 < uVar17),(int)local_458);
              if (pBVar24 < (BYTE *)0xffffffffffffff89) {
                __dest = __dest + (long)pBVar24;
                bVar29 = true;
                if ((((int)local_500 != 0) && (entropyMetadata.fseMetadata.lastCountSize != 0)) &&
                   (pBVar24 + entropyMetadata.fseMetadata.lastCountSize < (BYTE *)0x4)) {
                  if (pBVar24 + entropyMetadata.fseMetadata.lastCountSize != (BYTE *)0x3) {
                    __assert_fail("fseMetadata->lastCountSize + bitstreamSize == 3",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x2726,
                                  "size_t ZSTD_compressSubBlock_sequences(const ZSTD_fseCTables_t *, const ZSTD_fseCTablesMetadata_t *, const seqDef *, size_t, const BYTE *, const BYTE *, const BYTE *, const ZSTD_CCtx_params *, void *, size_t, const int, int)"
                                 );
                  }
                  bVar29 = false;
                  pBVar24 = (BYTE *)0x0;
                }
              }
              else {
                bVar29 = false;
              }
              dstCapacity_00 = 1;
              psVar23 = local_4f0;
              bVar27 = (byte)local_508;
              if (bVar29) {
                pBVar24 = (BYTE *)0x0;
                if (3 < (long)__dest - (long)pBVar10) {
                  pBVar24 = __dest + -(long)local_4f0;
                }
              }
            }
          }
          if (pBVar24 < (BYTE *)0xffffffffffffff89) {
            if (pBVar24 == (BYTE *)0x0) {
              bVar29 = false;
              pBVar22 = (BYTE *)0x0;
            }
            else {
              psVar23 = (seqDef *)((long)&psVar23->offset + (long)pBVar24);
              bVar29 = true;
            }
          }
          else {
            bVar29 = false;
            pBVar22 = pBVar24;
          }
          if (bVar29) {
            pBVar22 = (BYTE *)((long)psVar23 - (long)local_4d0);
            iVar7 = (bVar28 & bVar27 | 0xffffffec) + (int)pBVar22 * 8;
            *local_4d0 = (short)iVar7;
            *(char *)(local_4d0 + 1) = (char)((uint)iVar7 >> 0x10);
          }
        }
        psVar23 = sstart_1;
        if (pBVar22 < (BYTE *)0xffffffffffffff89) {
          if ((pBVar22 != (BYTE *)0x0) &&
             (pBVar24 = (BYTE *)(lVar16 + (long)local_518), pBVar22 < pBVar24)) {
            bVar29 = local_488 < pBVar24;
            local_488 = local_488 + -(long)pBVar24;
            if (bVar29) {
              __assert_fail("remaining >= decompressedSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x280a,
                            "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_entropyCTables_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const int, U32, void *, size_t)"
                           );
            }
            psVar23 = sstart_1 + (long)pBVar8;
            local_4c8 = local_4c8 + (long)local_518;
            local_4d0 = (undefined2 *)((long)local_4d0 + (long)pBVar22);
            local_498 = (uint *)((long)local_498 + (long)pBVar8);
            local_4a0 = (ZSTD_fseCTables_t *)((long)local_4a0 + (long)pBVar8);
            local_4a8 = local_4a8 + (long)pBVar8;
            local_518 = (ZSTD_compressedBlockState_t *)0x0;
            pBVar8 = (BYTE *)0x0;
            local_500 = local_500 & 0xffffffff00000000;
          }
        }
        else {
          dstCapacity_00 = (size_t)(pBVar22 < (BYTE *)0xffffffffffffff89);
          local_4e8 = pBVar22;
        }
      }
    } while ((char)dstCapacity_00 != '\0');
  }
  return (size_t)local_4e8;
}

Assistant:

size_t ZSTD_compressSuperBlock(ZSTD_CCtx* zc,
                               void* dst, size_t dstCapacity,
                               unsigned lastBlock) {
    ZSTD_entropyCTablesMetadata_t entropyMetadata;

    FORWARD_IF_ERROR(ZSTD_buildSuperBlockEntropy(&zc->seqStore,
          &zc->blockState.prevCBlock->entropy,
          &zc->blockState.nextCBlock->entropy,
          &zc->appliedParams,
          &entropyMetadata,
          zc->entropyWorkspace, HUF_WORKSPACE_SIZE /* statically allocated in resetCCtx */));

    return ZSTD_compressSubBlock_multi(&zc->seqStore,
            &zc->blockState.nextCBlock->entropy,
            &entropyMetadata,
            &zc->appliedParams,
            dst, dstCapacity,
            zc->bmi2, lastBlock,
            zc->entropyWorkspace, HUF_WORKSPACE_SIZE /* statically allocated in resetCCtx */);
}